

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O3

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  char *dir;
  long lVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  pointer pbVar14;
  int retVal;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string command;
  string output;
  uint local_14c;
  cmCommand *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  string local_138;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  string local_f8;
  string local_d8 [3];
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148 = &this->super_cmCommand;
  local_140 = args;
  if (pbVar14 == pbVar2) {
    local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"called with incorrect number of arguments","");
    cmCommand::SetError(local_148,local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
      operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  else {
    local_118 = &local_108;
    bVar12 = false;
    local_110 = 0;
    local_108 = 0;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    iVar13 = 0;
    bVar5 = false;
    bVar11 = false;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar14);
      if (iVar6 == 0) {
        iVar13 = iVar13 + 1;
LAB_00181230:
        bVar5 = false;
LAB_00181238:
        bVar12 = false;
      }
      else if (bVar11) {
        if (local_138._M_string_length != 0) {
          local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"called with incorrect number of arguments","");
          cmCommand::SetError(local_148,local_d8);
LAB_0018161e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
            operator_delete(local_d8[0]._M_dataplus._M_p,
                            local_d8[0].field_2._M_allocated_capacity + 1);
          }
          bVar5 = false;
          goto LAB_0018163d;
        }
        std::__cxx11::string::_M_assign((string *)&local_138);
        iVar13 = iVar13 + 1;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)pbVar14);
        if (iVar7 != 0) {
          if (bVar12) {
            if (local_f8._M_string_length != 0) {
              local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d8,"called with incorrect number of arguments","");
              cmCommand::SetError(local_148,local_d8);
              goto LAB_0018161e;
            }
            std::__cxx11::string::_M_assign((string *)&local_f8);
            iVar13 = iVar13 + 1;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)pbVar14);
            if (iVar7 != 0) {
              if (!bVar5) goto LAB_00181230;
              std::__cxx11::string::_M_append((char *)&local_118,(ulong)(pbVar14->_M_dataplus)._M_p)
              ;
              std::__cxx11::string::append((char *)&local_118);
            }
            iVar13 = iVar13 + 1;
            bVar5 = true;
          }
          goto LAB_00181238;
        }
        iVar13 = iVar13 + 1;
        bVar12 = true;
        bVar5 = false;
      }
      pvVar3 = local_140;
      pbVar14 = pbVar14 + 1;
      bVar11 = iVar6 == 0;
    } while (pbVar14 != pbVar2);
    local_68 = 0;
    local_60 = '\0';
    local_70 = &local_60;
    if (local_110 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
    else {
      cmSystemTools::ConvertToRunCommandPath
                (local_d8,(local_140->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
        operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_118);
    }
    sVar4 = local_138._M_string_length;
    local_14c = 0;
    paVar1 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    pbVar14 = (pvVar3->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    if (((long)(pvVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) - (long)iVar13 == 2
       ) {
      cmsys::SystemTools::MakeDirectory(pbVar14 + 1,(mode_t *)0x0);
      dir = (pvVar3->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    }
    else {
      dir = (char *)0x0;
    }
    bVar5 = RunCommand(local_70,&local_50,(int *)&local_14c,dir,sVar4 == 0,Auto);
    if (!bVar5) {
      local_14c = 0xffffffff;
    }
    if (local_138._M_string_length != 0) {
      uVar8 = std::__cxx11::string::find_first_not_of((char *)&local_50,0x482690,0);
      lVar9 = std::__cxx11::string::find_last_not_of((char *)&local_50,0x482690,0xffffffffffffffff);
      if (uVar8 == 0xffffffffffffffff) {
        uVar8 = 0;
      }
      lVar10 = local_50._M_string_length - 1;
      if (lVar9 != -1) {
        lVar10 = lVar9;
      }
      std::__cxx11::string::string
                ((string *)local_d8,(string *)&local_50,uVar8,(lVar10 - uVar8) + 1);
      cmMakefile::AddDefinition(local_148->Makefile,&local_138,local_d8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
        operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if (local_f8._M_string_length != 0) {
      sprintf((char *)local_d8,"%d",(ulong)local_14c);
      cmMakefile::AddDefinition(local_148->Makefile,&local_f8,(char *)local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    bVar5 = true;
LAB_0018163d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool cmExecProgramCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmSystemTools::ConvertToRunCommandPath(args[0]);
    command += " ";
    command += arguments;
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              args[1].c_str(), verbose);
  } else {
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
  }

  if (!return_variable.empty()) {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
  }

  return true;
}